

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O1

void __thiscall
CppLogger::CppLogger::CppLogger(CppLogger *this,Level t_Level,char *t_Name,bool exitOnFatal)

{
  long lVar1;
  initializer_list<CppLogger::FormatAttribute> t_Format;
  allocator<char> local_61;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string *local_50;
  string *local_48;
  FormatAttribute local_3c [3];
  
  this->m_Level = t_Level;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_Name,t_Name,&local_61);
  local_3c[0] = Time;
  local_3c[1] = Name;
  local_3c[2] = 4;
  t_Format._M_len = 3;
  t_Format._M_array = local_3c;
  Format::Format((Format *)&this->field_0x28,t_Format);
  lVar1 = 0x40;
  do {
    Format::Format((Format *)((long)&this->m_Level + lVar1),
                   (initializer_list<CppLogger::FormatAttribute>)ZEXT816(0));
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xa0);
  this->m_ExitOnFatal = exitOnFatal;
  this->m_TraceStream = (ostream *)&std::cout;
  this->m_InfoStream = (ostream *)&std::cout;
  this->m_WarnStream = (ostream *)&std::cout;
  this->m_ErrorStream = (ostream *)&std::cout;
  this->m_FatalErrorStream = (ostream *)&std::cout;
  local_58 = &(this->m_TraceColor).field_2;
  (this->m_TraceColor)._M_dataplus._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_TraceColor,Color::white_abi_cxx11_,
             DAT_00107240 + Color::white_abi_cxx11_);
  local_60 = &(this->m_InfoColor).field_2;
  (this->m_InfoColor)._M_dataplus._M_p = (pointer)local_60;
  local_48 = &this->m_TraceColor;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_InfoColor,Color::green_abi_cxx11_,
             DAT_001071a0 + Color::green_abi_cxx11_);
  (this->m_WarnColor)._M_dataplus._M_p = (pointer)&(this->m_WarnColor).field_2;
  local_50 = &this->m_InfoColor;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_WarnColor,Color::yellow_abi_cxx11_,
             DAT_001071c0 + Color::yellow_abi_cxx11_);
  (this->m_ErrorColor)._M_dataplus._M_p = (pointer)&(this->m_ErrorColor).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_ErrorColor,Color::red_abi_cxx11_,
             DAT_00107180 + Color::red_abi_cxx11_);
  (this->m_FatalErrorColor)._M_dataplus._M_p = (pointer)&(this->m_FatalErrorColor).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_FatalErrorColor,Color::red_abi_cxx11_,
             DAT_00107180 + Color::red_abi_cxx11_);
  return;
}

Assistant:

CppLogger::CppLogger(Level t_Level, const char* t_Name, bool exitOnFatal)
        :m_Level(t_Level), m_Name(t_Name), m_ExitOnFatal(exitOnFatal) {}